

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,cs::csym_info>::
     transfer<std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
  ::emplace((slot_type *)0x5ba9fc);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>::
  construct<std::pair<std::__cxx11::string,cs::csym_info>,std::pair<std::__cxx11::string,cs::csym_info>>
            (in_RSI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
                     *)&in_RDX->value,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
              *)0x5baa0f);
  destroy<std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>(in_RSI,in_RDX);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}